

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O1

void __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
::resetWith(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
            *this,SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
                  *other)

{
  StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  *pSVar1;
  StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  *pSVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  string local_b8;
  string local_98;
  path local_78;
  path local_50;
  
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  .register_.count_ =
       (other->
       super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
       ).
       super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
       .register_.count_;
  pSVar1 = (other->
           super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
           ).
           super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
           .register_.innerRegister_._M_t.
           super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
           .
           super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_*,_false>
           ._M_head_impl;
  (other->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  .register_.innerRegister_._M_t.
  super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
  .
  super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_*,_false>
  ._M_head_impl =
       (StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
        *)0x0;
  pSVar2 = (this->
           super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
           ).
           super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
           .register_.innerRegister_._M_t.
           super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
           .
           super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_*,_false>
           ._M_head_impl;
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  .register_.innerRegister_._M_t.
  super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
  .
  super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_*,_false>
  ._M_head_impl = pSVar1;
  if (pSVar2 != (StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
                 *)0x0) {
    (*(pSVar2->
      super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>
      )._vptr_Cloneable[2])();
  }
  peVar3 = (this->storageFile_).
           super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (peVar3->manager_).
           super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar3->manager_).
            super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
  ::getStorageFilePath_abi_cxx11_
            (&local_98,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
              *)other);
  std::filesystem::__cxx11::path::path(&local_50,&local_98,auto_format);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
  ::getStorageFilePath_abi_cxx11_
            (&local_b8,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
              *)this);
  std::filesystem::__cxx11::path::path(&local_78,&local_b8,auto_format);
  (*peVar4->_vptr_FileManager[4])(peVar4,&local_50,&local_78);
  std::filesystem::__cxx11::path::~path(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

virtual void resetWith(SingleFileIndexedStorage<T, IndexT, RegisterInfo> &&other) noexcept {
        getRegister() = std::move(other.getRegister());
        auto thisFileManager = getFileManager();
        assert(other.getFileManager() == thisFileManager);
        thisFileManager->swap(other.getStorageFilePath(), getStorageFilePath());
    }